

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O0

void __thiscall
nv::SlowCompressor::compressDXT1
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Color32 *pCVar4;
  scalar r;
  scalar g;
  scalar b;
  undefined1 local_588 [8];
  ColourSet colours;
  uint local_230;
  uint local_22c;
  uint x;
  uint y;
  WeightedClusterFit fit;
  BlockDXT1 local_70;
  BlockDXT1 block;
  ColorBlock rgba;
  uint h;
  uint w;
  Private *outputOptions_local;
  Private *compressionOptions_local;
  SlowCompressor *this_local;
  
  uVar2 = Image::width(this->m_image);
  uVar3 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&block);
  BlockDXT1::BlockDXT1(&local_70);
  squish::WeightedClusterFit::WeightedClusterFit((WeightedClusterFit *)&x);
  r = Vector4::x(&compressionOptions->colorWeight);
  g = Vector4::y(&compressionOptions->colorWeight);
  b = Vector4::z(&compressionOptions->colorWeight);
  squish::WeightedClusterFit::SetMetric((WeightedClusterFit *)&x,r,g,b);
  for (local_22c = 0; local_22c < uVar3; local_22c = local_22c + 4) {
    for (local_230 = 0; local_230 < uVar2; local_230 = local_230 + 4) {
      ColorBlock::init((ColorBlock *)&block,(EVP_PKEY_CTX *)this->m_image);
      bVar1 = ColorBlock::isSingleColor((ColorBlock *)&block);
      if (bVar1) {
        pCVar4 = ColorBlock::color((ColorBlock *)&block,0);
        Color32::Color32((Color32 *)(colours.m_weights_simd[0xf].m_v + 3),pCVar4);
        OptimalCompress::compressDXT1((Color32 *)(colours.m_weights_simd[0xf].m_v + 3),&local_70);
      }
      else {
        pCVar4 = ColorBlock::colors((ColorBlock *)&block);
        squish::ColourSet::ColourSet((ColourSet *)local_588,(u8 *)pCVar4,0,true);
        squish::WeightedClusterFit::SetColourSet((WeightedClusterFit *)&x,(ColourSet *)local_588,1);
        squish::ColourFit::Compress((ColourFit *)&x,&local_70);
      }
      if (outputOptions->outputHandler != (OutputHandler *)0x0) {
        (*outputOptions->outputHandler->_vptr_OutputHandler[3])
                  (outputOptions->outputHandler,&local_70,8);
      }
    }
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT1(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	squish::WeightedClusterFit fit;
	//squish::ClusterFit fit;
	//squish::FastClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			if (rgba.isSingleColor())
			{
				OptimalCompress::compressDXT1(rgba.color(0), &block);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), 0, true);
				fit.SetColourSet(&colours, squish::kDxt1);
				fit.Compress(&block);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}